

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_91bd::testShiftPixels(void)

{
  ostream *poVar1;
  void *this;
  int DY;
  int DX;
  Rand48 random_1;
  Rand48 random;
  FlatImage img2;
  int in_stack_00000198;
  int in_stack_0000019c;
  Image *in_stack_000001a0;
  FlatImage img1;
  unsigned_long in_stack_fffffffffffffdc8;
  Vec2<int> *in_stack_fffffffffffffdd0;
  Vec2<int> *in_stack_fffffffffffffdd8;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffde0;
  Box2i *in_stack_fffffffffffffde8;
  FlatImage *in_stack_fffffffffffffdf0;
  FlatImage *img;
  allocator<char> *in_stack_fffffffffffffe00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe08;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *paVar2;
  int in_stack_fffffffffffffe30;
  int dy;
  PixelType in_stack_fffffffffffffe34;
  int dx;
  string *in_stack_fffffffffffffe38;
  Image *in_stack_fffffffffffffe40;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  Vec2<int> local_170;
  Vec2<int> local_168 [16];
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [32];
  Vec2<int> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [4];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"pixel shifting");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = local_80;
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)this_00,0xf,0x14);
  Imath_2_5::Vec2<int>::Vec2(&local_88,0x2d,0x3c);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  Imf_2_5::FlatImage::FlatImage
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (LevelMode)((ulong)in_stack_fffffffffffffde0 >> 0x20),
             (LevelRoundingMode)in_stack_fffffffffffffde0);
  paVar2 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe30,(int)((ulong)paVar2 >> 0x20),SUB81((ulong)paVar2 >> 0x18,0));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  __s = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffe00);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe30,(int)((ulong)paVar2 >> 0x20),SUB81((ulong)paVar2 >> 0x18,0));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  Imath_2_5::Vec2<int>::Vec2(local_168,0xf,0x14);
  Imath_2_5::Vec2<int>::Vec2(&local_170,0x2d,0x3c);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  Imf_2_5::FlatImage::FlatImage
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (LevelMode)((ulong)in_stack_fffffffffffffde0 >> 0x20),
             (LevelRoundingMode)in_stack_fffffffffffffde0);
  __a = &local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe30,(int)((ulong)paVar2 >> 0x20),SUB81((ulong)paVar2 >> 0x18,0));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  img = (FlatImage *)&stack0xfffffffffffffe47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe30,(int)((ulong)paVar2 >> 0x20),SUB81((ulong)paVar2 >> 0x18,0));
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Rand48::Rand48((Rand48 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  fillChannels((Rand48 *)__a,img);
  Imath_2_5::Rand48::Rand48((Rand48 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  fillChannels((Rand48 *)__a,img);
  dx = 5;
  dy = 7;
  poVar1 = std::operator<<((ostream *)&std::cout,"    shifting, dx = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dx);
  poVar1 = std::operator<<(poVar1,", dy = ");
  this = (void *)std::ostream::operator<<(poVar1,dy);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imf_2_5::Image::shiftPixels(in_stack_000001a0,in_stack_0000019c,in_stack_00000198);
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  verifyImagesAreEqual
            ((FlatImage *)in_stack_fffffffffffffe40,(FlatImage *)in_stack_fffffffffffffe38,dx,dy);
  Imf_2_5::FlatImage::~FlatImage((FlatImage *)0x110b17);
  Imf_2_5::FlatImage::~FlatImage((FlatImage *)0x110b24);
  return;
}

Assistant:

void
testShiftPixels ()
{
    cout << "pixel shifting" << endl;

    FlatImage img1 (Box2i (V2i (15, 20), V2i (45, 60)), MIPMAP_LEVELS);
    img1.insertChannel ("A", HALF);
    img1.insertChannel ("B", HALF);

    FlatImage img2 (Box2i (V2i (15, 20), V2i (45, 60)), MIPMAP_LEVELS);
    img2.insertChannel ("A", HALF);
    img2.insertChannel ("B", HALF);

    cout << "    generating random pixel values" << endl;

    {
        Rand48 random (1);
        fillChannels (random, img1);
    }

    {
        Rand48 random (1);
        fillChannels (random, img2);
    }

    int DX = 5;
    int DY = 7;

    cout << "    shifting, dx = " << DX << ", dy = " << DY << endl;
    img2.shiftPixels (DX, DY);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2, DX, DY);
}